

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QStatusBarPrivate::SBItem>::relocate
          (QArrayDataPointer<QStatusBarPrivate::SBItem> *this,qsizetype offset,SBItem **data)

{
  SBItem *d_first;
  SBItem *pSVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<QStatusBarPrivate::SBItem,long_long>(this->ptr,this->size,d_first)
  ;
  if (data != (SBItem **)0x0) {
    pSVar1 = *data;
    if ((this->ptr <= pSVar1) && (pSVar1 < this->ptr + this->size)) {
      *data = pSVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }